

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_robust_access_pass.cpp
# Opt level: O1

uint32_t __thiscall
spvtools::opt::GraphicsRobustAccessPass::GetGlslInsts(GraphicsRobustAccessPass *this)

{
  undefined1 *args_3;
  Module *pMVar1;
  IRContext *pIVar2;
  FeatureManager *__ptr;
  int iVar3;
  uint32_t uVar4;
  uint uVar5;
  Operand *this_00;
  size_t sVar6;
  uint uVar7;
  size_t byte_index;
  Instruction *pIVar8;
  _func_int **pp_Var9;
  Instruction *inst;
  Instruction *pIVar10;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  import_inst;
  vector<unsigned_int,_std::allocator<unsigned_int>_> words;
  char glsl [13];
  uint32_t word;
  Instruction *local_e0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_d8;
  char local_b8 [16];
  undefined1 local_a8 [24];
  uint local_90 [2];
  uint *local_88;
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_80;
  undefined1 local_78 [32];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_58;
  int local_50 [2];
  IRContext *local_48;
  initializer_list<spvtools::opt::Operand> local_40;
  
  args_3 = &this->field_0x38;
  if (*(int *)&this->field_0x38 == 0) {
    builtin_strncpy(local_b8 + 8,".450",5);
    builtin_strncpy(local_b8,"GLSL.std",8);
    pMVar1 = (((this->super_Pass).context_)->module_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
             .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
    pIVar10 = *(Instruction **)
               ((long)&(pMVar1->ext_inst_imports_).super_IntrusiveList<spvtools::opt::Instruction> +
               0x10);
    pIVar8 = (Instruction *)
             ((long)&(pMVar1->ext_inst_imports_).super_IntrusiveList<spvtools::opt::Instruction> + 8
             );
    if (pIVar10 != pIVar8) {
      do {
        this_00 = Instruction::GetInOperand(pIVar10,0);
        Operand::AsString_abi_cxx11_((string *)local_a8,this_00);
        iVar3 = std::__cxx11::string::compare((char *)local_a8);
        if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) {
          operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
        }
        if (iVar3 == 0) {
          uVar4 = 0;
          if (pIVar10->has_result_id_ == true) {
            uVar4 = Instruction::GetSingleWordOperand(pIVar10,(uint)pIVar10->has_type_id_);
          }
          *(uint32_t *)args_3 = uVar4;
        }
        pIVar10 = (pIVar10->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      } while (pIVar10 != pIVar8);
    }
    if (*(int *)args_3 == 0) {
      uVar4 = Pass::TakeNextId(&this->super_Pass);
      *(uint32_t *)&this->field_0x38 = uVar4;
      local_a8._0_8_ = local_a8 + 0x10;
      sVar6 = strlen(local_b8);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,local_b8,local_b8 + sVar6);
      local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (uint *)0x0;
      local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
      local_78._0_4_ = 0;
      pp_Var9 = (_func_int **)0x0;
      do {
        uVar5 = 0;
        if (pp_Var9 < (ulong)local_a8._8_8_) {
          uVar5 = (uint)*(byte *)(local_a8._0_8_ + (long)pp_Var9);
        }
        uVar7 = (uint)pp_Var9 & 3;
        local_78._0_4_ = uVar5 << (char)uVar7 * '\b' | local_78._0_4_;
        if (uVar7 == 3) {
          if (local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_d8,
                       (iterator)
                       local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(uint *)local_78);
          }
          else {
            *local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = local_78._0_4_;
            local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          local_78._0_4_ = 0;
        }
        pp_Var9 = (_func_int **)((long)pp_Var9 + 1);
      } while (pp_Var9 <= (ulong)local_a8._8_8_);
      if (((int)local_a8._8_8_ + 1U & 3) != 0) {
        if (local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_d8,
                     (iterator)
                     local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(uint *)local_78);
        }
        else {
          *local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish = local_78._0_4_;
          local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
      }
      if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) {
        operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
      }
      local_48 = (this->super_Pass).context_;
      local_50[1] = 0xb;
      local_50[0] = 0;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector
                ((SmallVector<unsigned_int,_2UL> *)local_78,&local_d8);
      local_a8._0_4_ = 0xb;
      local_a8._8_8_ = &PTR__SmallVector_003e9b28;
      local_a8._16_8_ = 0;
      local_88 = local_90;
      local_80._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      utils::SmallVector<unsigned_int,_2UL>::operator=
                ((SmallVector<unsigned_int,_2UL> *)(local_a8 + 8),
                 (SmallVector<unsigned_int,_2UL> *)local_78);
      local_40._M_array = (iterator)local_a8;
      local_40._M_len = 1;
      MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
                ((spvtools *)&local_e0,&local_48,(Op *)(local_50 + 1),local_50,(uint *)args_3,
                 &local_40);
      local_a8._8_8_ = &PTR__SmallVector_003e9b28;
      if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           )local_80._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &local_80,local_80._M_head_impl);
      }
      local_80._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      local_78._0_8_ = &PTR__SmallVector_003e9b28;
      if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           )local_58._M_t.
            super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            .
            super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
            ._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &local_58,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   local_58._M_t.
                   super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   .
                   super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                   ._M_head_impl);
      }
      pIVar10 = local_e0;
      local_e0 = (Instruction *)0x0;
      utils::IntrusiveList<spvtools::opt::Instruction>::push_back
                (&(((((this->super_Pass).context_)->module_)._M_t.
                    super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                    .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl)->
                  ext_inst_imports_).super_IntrusiveList<spvtools::opt::Instruction>,pIVar10);
      (this->super_Pass).field_0x34 = 1;
      pIVar2 = (this->super_Pass).context_;
      if ((pIVar2->valid_analyses_ & kAnalysisBegin) != kAnalysisNone) {
        analysis::DefUseManager::AnalyzeInstDefUse
                  ((pIVar2->def_use_mgr_)._M_t.
                   super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                   .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                   _M_head_impl,pIVar10);
      }
      pIVar2 = (this->super_Pass).context_;
      __ptr = (pIVar2->feature_mgr_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
              .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
      (pIVar2->feature_mgr_)._M_t.
      super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
      ._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
      .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl =
           (FeatureManager *)0x0;
      if (__ptr != (FeatureManager *)0x0) {
        std::default_delete<spvtools::opt::FeatureManager>::operator()
                  ((default_delete<spvtools::opt::FeatureManager> *)&pIVar2->feature_mgr_,__ptr);
      }
      if (local_e0 != (Instruction *)0x0) {
        (**(code **)(*(long *)local_e0 + 8))();
      }
      if (local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_d8.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_d8.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
  }
  return *(uint32_t *)args_3;
}

Assistant:

uint32_t GraphicsRobustAccessPass::GetGlslInsts() {
  if (module_status_.glsl_insts_id == 0) {
    // This string serves double-duty as raw data for a string and for a vector
    // of 32-bit words
    const char glsl[] = "GLSL.std.450";
    // Use an existing import if we can.
    for (auto& inst : context()->module()->ext_inst_imports()) {
      if (inst.GetInOperand(0).AsString() == glsl) {
        module_status_.glsl_insts_id = inst.result_id();
      }
    }
    if (module_status_.glsl_insts_id == 0) {
      // Make a new import instruction.
      module_status_.glsl_insts_id = TakeNextId();
      std::vector<uint32_t> words = spvtools::utils::MakeVector(glsl);
      auto import_inst = MakeUnique<Instruction>(
          context(), spv::Op::OpExtInstImport, 0, module_status_.glsl_insts_id,
          std::initializer_list<Operand>{
              Operand{SPV_OPERAND_TYPE_LITERAL_STRING, std::move(words)}});
      Instruction* inst = import_inst.get();
      context()->module()->AddExtInstImport(std::move(import_inst));
      module_status_.modified = true;
      context()->AnalyzeDefUse(inst);
      // Invalidates the feature manager, since we added an extended instruction
      // set import.
      context()->ResetFeatureManager();
    }
  }
  return module_status_.glsl_insts_id;
}